

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

bool __thiscall
ON_PlaneSurface::CreatePseudoInfinitePlane
          (ON_PlaneSurface *this,ON_Plane *plane,int point_count,ON_3dPoint *point_list,
          double padding)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ON_Plane *pOVar4;
  long lVar5;
  ON_3dPoint *pOVar6;
  byte bVar7;
  double t;
  double s;
  double local_68;
  double local_60;
  ON_Interval local_58;
  ON_Interval local_48;
  double local_38;
  
  bVar7 = 0;
  local_38 = padding;
  bVar2 = ON_Plane::IsValid(plane);
  if ((((point_list != (ON_3dPoint *)0x0) && (0 < point_count)) && (bVar2)) &&
     (bVar2 = ON_IsValid(local_38), 0.0 <= local_38 && bVar2)) {
    lVar5 = 0;
    do {
      ON_Interval::ON_Interval((ON_Interval *)((long)local_58.m_t + lVar5));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    local_60 = -1.23432101234321e+308;
    local_68 = -1.23432101234321e+308;
    bVar2 = ON_Plane::ClosestPointTo(plane,*point_list,&local_60,&local_68);
    if (((bVar2) && (bVar2 = ON_IsValid(local_60), bVar2)) && (bVar2 = ON_IsValid(local_68), bVar2))
    {
      local_58.m_t[0] = local_60;
      local_58.m_t[1] = local_60;
      local_48.m_t[0] = local_68;
      local_48.m_t[1] = local_68;
      if (1 < point_count) {
        pOVar6 = point_list + 1;
        lVar5 = (ulong)(uint)point_count - 1;
        do {
          local_60 = -1.23432101234321e+308;
          local_68 = -1.23432101234321e+308;
          bVar2 = ON_Plane::ClosestPointTo(plane,*pOVar6,&local_60,&local_68);
          if (!bVar2) {
            return false;
          }
          bVar2 = ON_IsValid(local_60);
          if (!bVar2) {
            return false;
          }
          bVar2 = ON_IsValid(local_68);
          if (!bVar2) {
            return false;
          }
          if (local_58.m_t[0] <= local_60) {
            if (local_58.m_t[1] < local_60) {
              local_58.m_t[1] = local_60;
            }
          }
          else {
            local_58.m_t[0] = local_60;
          }
          if (local_48.m_t[0] <= local_68) {
            if (local_48.m_t[1] < local_68) {
              local_48.m_t[1] = local_68;
            }
          }
          else {
            local_48.m_t[0] = local_68;
          }
          pOVar6 = pOVar6 + 1;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      dVar1 = ON_Interval::Length(&local_58);
      local_60 = dVar1 * local_38 + local_38;
      if ((local_60 <= 0.0) && (bVar2 = ON_Interval::IsIncreasing(&local_58), !bVar2)) {
        local_60 = 1.0;
      }
      local_58.m_t[0] = local_58.m_t[0] - local_60;
      local_58.m_t[1] = local_60 + local_58.m_t[1];
      dVar1 = ON_Interval::Length(&local_48);
      local_68 = dVar1 * local_38 + local_38;
      if ((local_68 <= 0.0) && (bVar2 = ON_Interval::IsIncreasing(&local_48), !bVar2)) {
        local_68 = 1.0;
      }
      local_48.m_t[0] = local_48.m_t[0] - local_68;
      local_48.m_t[1] = local_68 + local_48.m_t[1];
      pOVar4 = &this->m_plane;
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pOVar4->origin).x = (plane->origin).x;
        plane = (ON_Plane *)((long)plane + (ulong)bVar7 * -0x10 + 8);
        pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar7 * -0x10 + 8);
      }
      *(double *)&this->field_0x90 = local_58.m_t[0];
      *(double *)&this->field_0x98 = local_58.m_t[1];
      *(double *)&this->field_0xa0 = local_48.m_t[0];
      *(double *)&this->field_0xa8 = local_48.m_t[1];
      *(double *)&this->field_0xb0 = local_58.m_t[0];
      *(double *)&this->field_0xb8 = local_58.m_t[1];
      *(double *)&this->field_0xc0 = local_48.m_t[0];
      *(double *)&this->field_0xc8 = local_48.m_t[1];
      iVar3 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])
                        (this,0);
      return (bool)(char)iVar3;
    }
  }
  return false;
}

Assistant:

bool ON_PlaneSurface::CreatePseudoInfinitePlane( 
        const ON_Plane& plane,
        int point_count,
        const ON_3dPoint* point_list,
        double padding
        )
{
  if ( !plane.IsValid() )
    return false;
  if ( point_count < 1 )
    return false;
  if ( 0 == point_list )
    return false;
  if ( !ON_IsValid(padding) || padding < 0.0 )
    return false;

  ON_Interval plane_domain[2];
  double s, t;
  s = ON_UNSET_VALUE;
  t = ON_UNSET_VALUE;
  if ( !plane.ClosestPointTo( point_list[0], &s, &t ) || !ON_IsValid(s) || !ON_IsValid(t) )
    return 0;
  plane_domain[0].m_t[1] = plane_domain[0].m_t[0] = s;
  plane_domain[1].m_t[1] = plane_domain[1].m_t[0] = t;
  
  for ( int i = 1; i < point_count; i++ )
  {
    s = ON_UNSET_VALUE;
    t = ON_UNSET_VALUE;
    if ( !plane.ClosestPointTo( point_list[i], &s, &t ) || !ON_IsValid(s) || !ON_IsValid(t) )
      return 0;
    if ( s < plane_domain[0].m_t[0] ) plane_domain[0].m_t[0] = s; else if ( s > plane_domain[0].m_t[1] ) plane_domain[0].m_t[1] = s;
    if ( t < plane_domain[1].m_t[0] ) plane_domain[1].m_t[0] = t; else if ( t > plane_domain[1].m_t[1] ) plane_domain[1].m_t[1] = t;
  }

  s = padding*plane_domain[0].Length() + padding;
  if ( !(s > 0.0) && !plane_domain[0].IsIncreasing() )
    s = 1.0;
  plane_domain[0].m_t[0] -= s;
  plane_domain[0].m_t[1] += s;

  t = padding*plane_domain[1].Length() + padding;
  if ( !(t > 0.0) && !plane_domain[1].IsIncreasing() )
    t = 1.0;
  plane_domain[1].m_t[0] -= t;
  plane_domain[1].m_t[1] += t;

  m_plane = plane;
  m_domain[0] = plane_domain[0];
  m_domain[1] = plane_domain[1];
  m_extents[0] = plane_domain[0];
  m_extents[1] = plane_domain[1];

  return IsValid()?true:false;
}